

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int getPageMMap(Pager *pPager,Pgno pgno,DbPage **ppPage,int flags)

{
  void *pvVar1;
  int iVar2;
  DbPage *__s;
  u64 n;
  u32 iFrame;
  void *pData;
  u32 local_44;
  ulong local_40;
  void *local_38;
  
  local_44 = 0;
  if (pgno < 2) {
    if (pgno == 0) {
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xdb6c,
                  "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
      return 0xb;
    }
LAB_0013771a:
    iVar2 = getPageNormal(pPager,pgno,ppPage,flags);
    return iVar2;
  }
  if (((flags & 2U) == 0) && (pPager->eState != '\x01')) goto LAB_0013771a;
  if (pPager->pWal != (Wal *)0x0) {
    iVar2 = sqlite3WalFindFrame(pPager->pWal,pgno,&local_44);
    if (iVar2 != 0) {
      *ppPage = (DbPage *)0x0;
      return iVar2;
    }
    if (local_44 != 0) goto LAB_0013771a;
  }
  local_38 = (void *)0x0;
  local_40 = (ulong)(pgno - 1);
  iVar2 = (*pPager->fd->pMethods->xFetch)
                    (pPager->fd,(long)pPager->pageSize * local_40,pPager->pageSize,&local_38);
  if (local_38 == (void *)0x0 || iVar2 != 0) {
    if (iVar2 == 0) goto LAB_0013771a;
LAB_00137805:
    __s = (DbPage *)0x0;
  }
  else {
    if (((pPager->eState < 2) && (pPager->tempFile == '\0')) ||
       (__s = sqlite3PagerLookup(pPager,pgno), __s == (DbPage *)0x0)) {
      pvVar1 = local_38;
      __s = pPager->pMmapFreelist;
      if (__s == (DbPage *)0x0) {
        n = (ulong)pPager->nExtra + 0x48;
        __s = (DbPage *)sqlite3Malloc(n);
        if (__s == (DbPage *)0x0) {
          (*pPager->fd->pMethods->xUnfetch)(pPager->fd,(long)pPager->pageSize * local_40,pvVar1);
          iVar2 = 7;
          goto LAB_00137805;
        }
        memset(__s,0,n);
        __s->pExtra = __s + 1;
        __s->flags = 0x20;
        __s->nRef = 1;
        __s->pPager = pPager;
      }
      else {
        pPager->pMmapFreelist = __s->pDirty;
        __s->pDirty = (PgHdr *)0x0;
        *(undefined8 *)__s->pExtra = 0;
      }
      __s->pgno = pgno;
      __s->pData = pvVar1;
      pPager->nMmapOut = pPager->nMmapOut + 1;
    }
    else {
      (*pPager->fd->pMethods->xUnfetch)(pPager->fd,(long)pPager->pageSize * local_40,local_38);
    }
    iVar2 = 0;
  }
  *ppPage = __s;
  return iVar2;
}

Assistant:

static int getPageMMap(
  Pager *pPager,      /* The pager open on the database file */
  Pgno pgno,          /* Page number to fetch */
  DbPage **ppPage,    /* Write a pointer to the page here */
  int flags           /* PAGER_GET_XXX flags */
){
  int rc = SQLITE_OK;
  PgHdr *pPg = 0;
  u32 iFrame = 0;                 /* Frame to read from WAL file */

  /* It is acceptable to use a read-only (mmap) page for any page except
  ** page 1 if there is no write-transaction open or the ACQUIRE_READONLY
  ** flag was specified by the caller. And so long as the db is not a 
  ** temporary or in-memory database.  */
  const int bMmapOk = (pgno>1
   && (pPager->eState==PAGER_READER || (flags & PAGER_GET_READONLY))
  );

  assert( USEFETCH(pPager) );
#ifdef SQLITE_HAS_CODEC
  assert( pPager->xCodec==0 );
#endif

  /* Optimization note:  Adding the "pgno<=1" term before "pgno==0" here
  ** allows the compiler optimizer to reuse the results of the "pgno>1"
  ** test in the previous statement, and avoid testing pgno==0 in the
  ** common case where pgno is large. */
  if( pgno<=1 && pgno==0 ){
    return SQLITE_CORRUPT_BKPT;
  }
  assert( pPager->eState>=PAGER_READER );
  assert( assert_pager_state(pPager) );
  assert( pPager->hasHeldSharedLock==1 );
  assert( pPager->errCode==SQLITE_OK );

  if( bMmapOk && pagerUseWal(pPager) ){
    rc = sqlite3WalFindFrame(pPager->pWal, pgno, &iFrame);
    if( rc!=SQLITE_OK ){
      *ppPage = 0;
      return rc;
    }
  }
  if( bMmapOk && iFrame==0 ){
    void *pData = 0;
    rc = sqlite3OsFetch(pPager->fd, 
        (i64)(pgno-1) * pPager->pageSize, pPager->pageSize, &pData
    );
    if( rc==SQLITE_OK && pData ){
      if( pPager->eState>PAGER_READER || pPager->tempFile ){
        pPg = sqlite3PagerLookup(pPager, pgno);
      }
      if( pPg==0 ){
        rc = pagerAcquireMapPage(pPager, pgno, pData, &pPg);
      }else{
        sqlite3OsUnfetch(pPager->fd, (i64)(pgno-1)*pPager->pageSize, pData);
      }
      if( pPg ){
        assert( rc==SQLITE_OK );
        *ppPage = pPg;
        return SQLITE_OK;
      }
    }
    if( rc!=SQLITE_OK ){
      *ppPage = 0;
      return rc;
    }
  }
  return getPageNormal(pPager, pgno, ppPage, flags);
}